

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O1

FieldDescriptor ** google::protobuf::compiler::java::SortFieldsByNumber(Descriptor *descriptor)

{
  int iVar1;
  long lVar2;
  FieldDescriptor **ppFVar3;
  FieldDescriptor *pFVar4;
  ulong uVar5;
  ulong uVar6;
  
  iVar1 = descriptor->field_count_;
  uVar6 = (ulong)iVar1;
  uVar5 = 0xffffffffffffffff;
  if (-1 < (long)uVar6) {
    uVar5 = uVar6 * 8;
  }
  ppFVar3 = (FieldDescriptor **)operator_new__(uVar5);
  if (0 < (long)uVar6) {
    pFVar4 = descriptor->fields_;
    uVar5 = 0;
    do {
      ppFVar3[uVar5] = pFVar4;
      uVar5 = uVar5 + 1;
      pFVar4 = pFVar4 + 1;
    } while (uVar6 != uVar5);
  }
  if (iVar1 != 0) {
    lVar2 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<google::protobuf::FieldDescriptor_const**,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::java::FieldOrderingByNumber>>
              (ppFVar3,ppFVar3 + uVar6,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<google::protobuf::FieldDescriptor_const**,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::java::FieldOrderingByNumber>>
              (ppFVar3,ppFVar3 + uVar6);
  }
  return ppFVar3;
}

Assistant:

const FieldDescriptor** SortFieldsByNumber(const Descriptor* descriptor) {
  const FieldDescriptor** fields =
      new const FieldDescriptor*[descriptor->field_count()];
  for (int i = 0; i < descriptor->field_count(); i++) {
    fields[i] = descriptor->field(i);
  }
  std::sort(fields, fields + descriptor->field_count(),
            FieldOrderingByNumber());
  return fields;
}